

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WindowCompare(Parse *pParse,Window *p1,Window *p2,int bFilter)

{
  uint in_ECX;
  Expr *in_RDX;
  Parse *in_RSI;
  ExprList *in_RDI;
  int res;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  uVar1 = 0xaaaaaaaa;
  if ((in_RSI == (Parse *)0x0) || (in_RDX == (Expr *)0x0)) {
    iVar2 = 1;
  }
  else if (in_RSI->isMultiWrite == *(u8 *)&in_RDX->x) {
    if (in_RSI->mayAbort == *(u8 *)((long)&in_RDX->x + 1)) {
      if (in_RSI->hasCompound == *(u8 *)((long)&in_RDX->x + 2)) {
        if (in_RSI->disableLookaside == *(u8 *)((long)&in_RDX->x + 4)) {
          iVar2 = sqlite3ExprCompare(in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,0xaaaaaaaa),0);
          if (iVar2 == 0) {
            iVar2 = sqlite3ExprCompare(in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,uVar1),0);
            if (iVar2 == 0) {
              iVar2 = sqlite3ExprListCompare
                                ((ExprList *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 in_RDI,(int)((ulong)in_RSI >> 0x20));
              if (((iVar2 == 0) &&
                  (iVar2 = sqlite3ExprListCompare
                                     ((ExprList *)
                                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                      in_RDI,(int)((ulong)in_RSI >> 0x20)), iVar2 == 0)) &&
                 ((in_ECX == 0 ||
                  (iVar2 = sqlite3ExprCompare(in_RSI,in_RDX,(Expr *)((ulong)in_ECX << 0x20),0),
                  iVar2 == 0)))) {
                iVar2 = 0;
              }
            }
            else {
              iVar2 = 1;
            }
          }
          else {
            iVar2 = 1;
          }
        }
        else {
          iVar2 = 1;
        }
      }
      else {
        iVar2 = 1;
      }
    }
    else {
      iVar2 = 1;
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WindowCompare(
  const Parse *pParse,
  const Window *p1,
  const Window *p2,
  int bFilter
){
  int res;
  if( NEVER(p1==0) || NEVER(p2==0) ) return 1;
  if( p1->eFrmType!=p2->eFrmType ) return 1;
  if( p1->eStart!=p2->eStart ) return 1;
  if( p1->eEnd!=p2->eEnd ) return 1;
  if( p1->eExclude!=p2->eExclude ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pStart, p2->pStart, -1) ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pEnd, p2->pEnd, -1) ) return 1;
  if( (res = sqlite3ExprListCompare(p1->pPartition, p2->pPartition, -1)) ){
    return res;
  }
  if( (res = sqlite3ExprListCompare(p1->pOrderBy, p2->pOrderBy, -1)) ){
    return res;
  }
  if( bFilter ){
    if( (res = sqlite3ExprCompare(pParse, p1->pFilter, p2->pFilter, -1)) ){
      return res;
    }
  }
  return 0;
}